

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.h
# Opt level: O2

int __thiscall CVmObjPageEntry::is_deletable(CVmObjPageEntry *this)

{
  ushort uVar1;
  
  uVar1 = *(ushort *)&this->field_0x14;
  if ((uVar1 & 1) != 0) {
    return 1;
  }
  if ((uVar1 & 0xc) != 0) {
    return 0;
  }
  return (int)((uVar1 & 0x30) == 0x20);
}

Assistant:

int is_deletable() const
    {
        return (free_
                || (reachable_ == VMOBJ_UNREACHABLE
                    && finalize_state_ == VMOBJ_FINALIZED));
    }